

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::PlatformIs64Bit(cmMakefile *this)

{
  int iVar1;
  char *__nptr;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *sizeof_dptr;
  cmMakefile *this_local;
  
  sizeof_dptr = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_SIZEOF_VOID_P",&local_41);
  __nptr = GetDefinition(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  if (__nptr == (char *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    local_20 = __nptr;
    iVar1 = atoi(__nptr);
    this_local._7_1_ = iVar1 == 8;
  }
  return this_local._7_1_;
}

Assistant:

bool cmMakefile::PlatformIs64Bit() const
{
  if (const char* sizeof_dptr = this->GetDefinition("CMAKE_SIZEOF_VOID_P")) {
    return atoi(sizeof_dptr) == 8;
  }
  return false;
}